

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void update_call_mem_live(gen_ctx_t gen_ctx,bitmap_t mem_live,MIR_insn_t call_insn)

{
  uchar *puVar1;
  MIR_type_t type;
  MIR_item_t pMVar2;
  bitmap_el_t *pbVar3;
  MIR_context_t ctx;
  long lVar4;
  long lVar5;
  ulong uVar6;
  VARR_mem_attr_t *pVVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  VARR_mem_attr_t *pVVar11;
  char *pcVar12;
  bitmap_t bm;
  MIR_alias_t *pMVar13;
  gen_ctx_t pgVar14;
  long lVar15;
  int iVar16;
  undefined1 *in_R8;
  size_t sVar17;
  mem_attr_t *pmVar18;
  
  uVar9 = (int)*(ulong *)&call_insn->field_0x18 - 0xaa;
  if (uVar9 < 0xfffffffd) {
    __assert_fail("MIR_call_code_p (call_insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1366,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
  }
  if ((call_insn->ops[0].field_0x8 != '\b') ||
     (pMVar2 = call_insn->ops[0].u.ref, pMVar2->item_type != MIR_proto_item)) {
LAB_0016970f:
    __assert_fail("call_insn->ops[0].mode == MIR_OP_REF && call_insn->ops[0].u.ref->item_type == MIR_proto_item"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1368,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
  }
  if (gen_ctx->full_escape_p == '\0') {
    if (uVar9 < 0xfffffffd) goto LAB_00169757;
    uVar10 = (ulong)(((pMVar2->u).proto)->nres + 1);
    uVar6 = *(ulong *)&call_insn->field_0x18 >> 0x20;
    lVar15 = CONCAT71((int7)((ulong)pMVar2 >> 8),uVar10 < uVar6);
    pgVar14 = gen_ctx;
    if (uVar10 < uVar6) {
      pgVar14 = (gen_ctx_t)-uVar6;
      pcVar12 = &call_insn->ops[uVar10].field_0x8;
      do {
        if ((((*pcVar12 == '\v') || (*pcVar12 == '\x02')) && (*(long *)(pcVar12 + -8) != 0)) &&
           (in_R8 = *(undefined1 **)(*(long *)(pcVar12 + -8) + 8), (in_R8[9] & 3) != 0)) break;
        lVar15 = CONCAT71((int7)((ulong)lVar15 >> 8),uVar10 + 1 < uVar6);
        in_R8 = (undefined1 *)((long)pgVar14->call_used_hard_regs + (uVar10 - 0x66));
        pcVar12 = pcVar12 + 0x30;
        uVar10 = uVar10 + 1;
      } while (in_R8 != &DAT_00000001);
    }
    iVar16 = (int)in_R8;
    if ((char)lVar15 == '\0') {
      pVVar11 = gen_ctx->mem_attrs;
      if (pVVar11 == (VARR_mem_attr_t *)0x0) {
        update_call_mem_live_cold_3();
        if (pgVar14->mem_attrs == (VARR_mem_attr_t *)0x0) {
          make_live_from_mem_cold_3();
        }
        else if (*(char *)(lVar15 + 8) == '\v') {
          pVVar7 = pgVar14->mem_attrs;
          if (pVVar7 != (VARR_mem_attr_t *)0x0) {
            pMVar13 = &pgVar14->mem_attrs->varr[1].nonalias;
            uVar10 = 1;
            do {
              if (pVVar7->els_num <= uVar10) {
                return;
              }
              if ((((*(MIR_alias_t *)(lVar15 + 0x14) == pMVar13[-1]) ||
                   (*(MIR_alias_t *)(lVar15 + 0x14) == 0)) || (pMVar13[-1] == 0)) &&
                 ((*pMVar13 == 0 || *(MIR_alias_t *)(lVar15 + 0x18) == 0) ||
                  *(MIR_alias_t *)(lVar15 + 0x18) != *pMVar13)) {
                if ((iVar16 != 0) && ((((mem_attr_t *)(pMVar13 + -3))->alloca_flag & 2) != 0)) {
                  uVar6 = uVar10 & 0xffffffff;
                  if ((uVar6 == 0) || (uVar9 = *(uint *)(lVar15 + 0x1c), uVar9 == 0))
                  goto LAB_00169952;
                  pmVar18 = pVVar7->varr;
                  if ((((pmVar18[uVar9].disp_def_p != '\0') && (pmVar18[uVar6].disp_def_p != '\0'))
                      && (pmVar18[uVar9].def_insn != (MIR_insn_t)0x0)) &&
                     (pmVar18[uVar9].def_insn == pmVar18[uVar6].def_insn)) {
                    type = pMVar13[-2];
                    ctx = pgVar14->ctx;
                    lVar4 = pmVar18[uVar9].disp;
                    lVar5 = pmVar18[uVar6].disp;
                    sVar17 = _MIR_type_size(ctx,(uint)*(byte *)(lVar15 + 0x10));
                    sVar8 = _MIR_type_size(ctx,type);
                    if (((lVar4 < lVar5) || ((long)(sVar8 + lVar5) <= lVar4)) &&
                       ((lVar5 < lVar4 || ((long)(sVar17 + lVar4) <= lVar5)))) goto LAB_00169922;
                  }
                }
                bitmap_expand(bm,uVar10 + 1);
                if (bm == (bitmap_t)0x0) {
                  make_live_from_mem_cold_1();
LAB_00169952:
                  __assert_fail("nloc1 != 0 && nloc2 != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x137a,
                                "int alloca_mem_intersect_p(gen_ctx_t, uint32_t, MIR_type_t, uint32_t, MIR_type_t)"
                               );
                }
                uVar6 = 1L << (uVar10 & 0x3f);
                bm->varr[uVar10 >> 6] = bm->varr[uVar10 >> 6] | uVar6;
                if ((pVVar11 != (VARR_mem_attr_t *)0x0) && (uVar10 < pVVar11->els_num << 6)) {
                  puVar1 = &pVVar11->varr->alloca_flag + (uVar10 >> 6) * 8;
                  *(ulong *)puVar1 = *(ulong *)puVar1 & ~uVar6;
                }
              }
LAB_00169922:
              uVar10 = uVar10 + 1;
              pVVar7 = pgVar14->mem_attrs;
              pMVar13 = pMVar13 + 8;
            } while (pVVar7 != (VARR_mem_attr_t *)0x0);
          }
          make_live_from_mem_cold_2();
          return;
        }
        __assert_fail("mem_ref->mode == MIR_OP_VAR_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x138a,
                      "void make_live_from_mem(gen_ctx_t, MIR_op_t *, bitmap_t, bitmap_t, int)");
      }
      pVVar7 = gen_ctx->mem_attrs;
      if (pVVar7 != (VARR_mem_attr_t *)0x0) {
        pmVar18 = pVVar11->varr;
        uVar10 = 1;
        do {
          pmVar18 = pmVar18 + 1;
          if (pVVar7->els_num <= uVar10) {
            return;
          }
          if (pmVar18->alloca_flag == '\0') {
            bitmap_expand(mem_live,uVar10 + 1);
            if (mem_live == (bitmap_t)0x0) goto LAB_0016970a;
            mem_live->varr[uVar10 >> 6] = mem_live->varr[uVar10 >> 6] | 1L << (uVar10 & 0x3f);
          }
          uVar10 = uVar10 + 1;
          pVVar7 = gen_ctx->mem_attrs;
        } while (pVVar7 != (VARR_mem_attr_t *)0x0);
      }
      update_call_mem_live_cold_2();
LAB_0016970a:
      update_call_mem_live_cold_1();
      goto LAB_0016970f;
    }
  }
  if (gen_ctx->mem_attrs == (VARR_mem_attr_t *)0x0) {
    update_call_mem_live_cold_5();
  }
  else {
    sVar17 = gen_ctx->mem_attrs->els_num;
    bitmap_expand(mem_live,sVar17 + 1);
    if (mem_live != (bitmap_t)0x0) {
      if (sVar17 != 0) {
        pbVar3 = mem_live->varr;
        uVar10 = 1;
        do {
          uVar6 = (ulong)((uint)uVar10 & 0x3f);
          lVar15 = 0x40 - (ulong)((int)sVar17 + (uint)uVar10 & 0x3f);
          if (0x40 - uVar6 <= sVar17) {
            lVar15 = 0;
          }
          pbVar3[uVar10 >> 6] =
               pbVar3[uVar10 >> 6] | (0xffffffffffffffffU >> (lVar15 + uVar6 & 0x3f)) << uVar6;
          lVar15 = 0x40 - (lVar15 + uVar6);
          uVar10 = uVar10 + lVar15;
          sVar17 = sVar17 - lVar15;
        } while (sVar17 != 0);
      }
      return;
    }
  }
  update_call_mem_live_cold_4();
LAB_00169757:
  __assert_fail("MIR_call_code_p (call_insn->code) && call_insn->ops[0].mode == MIR_OP_REF && call_insn->ops[0].u.ref->item_type == MIR_proto_item"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x135b,"int alloca_arg_p(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static void update_call_mem_live (gen_ctx_t gen_ctx, bitmap_t mem_live, MIR_insn_t call_insn) {
  gen_assert (MIR_call_code_p (call_insn->code));
  gen_assert (call_insn->ops[0].mode == MIR_OP_REF
              && call_insn->ops[0].u.ref->item_type == MIR_proto_item);
  if (full_escape_p || alloca_arg_p (gen_ctx, call_insn)) {
    bitmap_set_bit_range_p (mem_live, 1, VARR_LENGTH (mem_attr_t, mem_attrs));
  } else {
    mem_attr_t *mem_attr_addr = VARR_ADDR (mem_attr_t, mem_attrs);

    for (size_t i = 1; i < VARR_LENGTH (mem_attr_t, mem_attrs); i++)
      if (!mem_attr_addr[i].alloca_flag) bitmap_set_bit_p (mem_live, i);
  }
}